

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::BitwiseAndFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  LogicalTypeId LVar1;
  pointer pSVar2;
  LogicalType varargs;
  LogicalType varargs_00;
  NotImplementedException *this_00;
  ScalarFunction *function;
  pointer function_00;
  long lVar3;
  ScalarFunctionSet *in_RDI;
  pointer other;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  undefined4 in_stack_fffffffffffffb64;
  undefined4 in_stack_fffffffffffffb6c;
  FunctionNullHandling in_stack_fffffffffffffb78;
  allocator_type local_482;
  allocator local_481;
  code *in_stack_fffffffffffffb80;
  LogicalType local_448 [2];
  scalar_function_t local_418;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3f8;
  LogicalType local_3e0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3c8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3b0;
  _Any_data local_398;
  undefined8 local_388;
  undefined8 uStack_380;
  LogicalType local_378;
  LogicalType local_360;
  LogicalType local_348;
  ScalarFunction local_330;
  ScalarFunction local_208;
  BaseScalarFunction local_e0;
  
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  LogicalType::Integral();
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  other = local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          _M_impl.super__Vector_impl_data._M_start;
  do {
    if (other == local_3f8.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish) {
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3f8);
      LogicalType::LogicalType(local_448,BIT);
      LogicalType::LogicalType(local_448 + 1,BIT);
      __l_00._M_len = 2;
      __l_00._M_array = local_448;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_3c8,__l_00,(allocator_type *)&stack0xfffffffffffffb80);
      LogicalType::LogicalType(&local_3e0,BIT);
      local_418.super__Function_base._M_functor._8_8_ = 0;
      local_418.super__Function_base._M_functor._M_unused._M_object = BitwiseANDOperation;
      local_418._M_invoker =
           ::std::
           _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
           ::_M_invoke;
      local_418.super__Function_base._M_manager =
           ::std::
           _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
           ::_M_manager;
      LogicalType::LogicalType(&local_378,INVALID);
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      varargs_00._0_8_ = &local_378;
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           in_stack_fffffffffffffb64;
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = in_stack_fffffffffffffb6c;
      ScalarFunction::ScalarFunction
                (&local_330,(vector<duckdb::LogicalType,_true> *)&local_3c8,&local_3e0,&local_418,
                 (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
                 (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_00,CONSISTENT,
                 in_stack_fffffffffffffb78,in_stack_fffffffffffffb80);
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>
                (&this->
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                 &local_330);
      ScalarFunction::~ScalarFunction(&local_330);
      LogicalType::~LogicalType(&local_378);
      ::std::_Function_base::~_Function_base(&local_418.super__Function_base);
      LogicalType::~LogicalType(&local_3e0);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3c8);
      lVar3 = 0x18;
      do {
        LogicalType::~LogicalType((LogicalType *)(&local_448[0].id_ + lVar3));
        lVar3 = lVar3 + -0x18;
      } while (lVar3 != -0x18);
      pSVar2 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
               super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
               super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (function_00 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
                         super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>
                         .
                         super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>
                         ._M_impl.super__Vector_impl_data._M_start; function_00 != pSVar2;
          function_00 = function_00 + 1) {
        BaseScalarFunction::SetReturnsError(&local_e0,&function_00->super_BaseScalarFunction);
        BaseScalarFunction::~BaseScalarFunction(&local_e0);
      }
      return in_RDI;
    }
    LogicalType::LogicalType(local_448,other);
    LogicalType::LogicalType(local_448 + 1,other);
    __l._M_len = 2;
    __l._M_array = local_448;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (&local_3b0,__l,&local_482);
    LogicalType::LogicalType(&local_348,other);
    local_388 = 0;
    uStack_380 = 0;
    local_398._M_unused._M_object = (void *)0x0;
    local_398._8_8_ = 0;
    LVar1 = other->id_;
    switch(LVar1) {
    case TINYINT:
      in_stack_fffffffffffffb80 =
           ScalarFunction::
           BinaryFunction<signed_char,signed_char,signed_char,duckdb::BitwiseANDOperator>;
      break;
    case SMALLINT:
      in_stack_fffffffffffffb80 =
           ScalarFunction::BinaryFunction<short,short,short,duckdb::BitwiseANDOperator>;
      break;
    case INTEGER:
      in_stack_fffffffffffffb80 =
           ScalarFunction::BinaryFunction<int,int,int,duckdb::BitwiseANDOperator>;
      break;
    case BIGINT:
      in_stack_fffffffffffffb80 =
           ScalarFunction::BinaryFunction<long,long,long,duckdb::BitwiseANDOperator>;
      break;
    default:
      switch(LVar1) {
      case UTINYINT:
        in_stack_fffffffffffffb80 =
             ScalarFunction::
             BinaryFunction<unsigned_char,unsigned_char,unsigned_char,duckdb::BitwiseANDOperator>;
        break;
      case USMALLINT:
        in_stack_fffffffffffffb80 =
             ScalarFunction::
             BinaryFunction<unsigned_short,unsigned_short,unsigned_short,duckdb::BitwiseANDOperator>
        ;
        break;
      case UINTEGER:
        in_stack_fffffffffffffb80 =
             ScalarFunction::
             BinaryFunction<unsigned_int,unsigned_int,unsigned_int,duckdb::BitwiseANDOperator>;
        break;
      case UBIGINT:
        in_stack_fffffffffffffb80 =
             ScalarFunction::
             BinaryFunction<unsigned_long,unsigned_long,unsigned_long,duckdb::BitwiseANDOperator>;
        break;
      default:
        if (LVar1 == UHUGEINT) {
          in_stack_fffffffffffffb80 =
               ScalarFunction::
               BinaryFunction<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BitwiseANDOperator>
          ;
        }
        else {
          if (LVar1 != HUGEINT) {
            this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&stack0xfffffffffffffb80,
                       "Unimplemented type for GetScalarIntegerBinaryFunction",&local_481);
            NotImplementedException::NotImplementedException
                      (this_00,(string *)&stack0xfffffffffffffb80);
            __cxa_throw(this_00,&NotImplementedException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          in_stack_fffffffffffffb80 =
               ScalarFunction::
               BinaryFunction<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::BitwiseANDOperator>
          ;
        }
      }
    }
    ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
               local_398._M_pod_data,
               (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)&stack0xfffffffffffffb80)
    ;
    LogicalType::LogicalType(&local_360,INVALID);
    varargs.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
    varargs._0_8_ = &local_360;
    varargs.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
         in_stack_fffffffffffffb64;
    varargs.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         0;
    varargs.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         in_stack_fffffffffffffb6c;
    ScalarFunction::ScalarFunction
              (&local_208,(vector<duckdb::LogicalType,_true> *)&local_3b0,&local_348,
               (scalar_function_t *)&local_398,(bind_scalar_function_t)0x0,
               (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
               (init_local_state_t)0x0,varargs,CONSISTENT,in_stack_fffffffffffffb78,
               in_stack_fffffffffffffb80);
    ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
    emplace_back<duckdb::ScalarFunction>
              (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
               &local_208);
    ScalarFunction::~ScalarFunction(&local_208);
    LogicalType::~LogicalType(&local_360);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_398);
    LogicalType::~LogicalType(&local_348);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3b0);
    lVar3 = 0x18;
    do {
      LogicalType::~LogicalType((LogicalType *)(&local_448[0].id_ + lVar3));
      lVar3 = lVar3 + -0x18;
    } while (lVar3 != -0x18);
    other = other + 1;
  } while( true );
}

Assistant:

ScalarFunctionSet BitwiseAndFun::GetFunctions() {
	ScalarFunctionSet functions;
	for (auto &type : LogicalType::Integral()) {
		functions.AddFunction(
		    ScalarFunction({type, type}, type, GetScalarIntegerBinaryFunction<BitwiseANDOperator>(type)));
	}
	functions.AddFunction(ScalarFunction({LogicalType::BIT, LogicalType::BIT}, LogicalType::BIT, BitwiseANDOperation));
	for (auto &function : functions.functions) {
		BaseScalarFunction::SetReturnsError(function);
	}
	return functions;
}